

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O1

Tas_Man_t * Tas_ManAlloc(Gia_Man_t *pAig,int nBTLimit)

{
  int iVar1;
  Tas_Man_t *pTVar2;
  Gia_Obj_t **ppGVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  float *pfVar8;
  
  pTVar2 = (Tas_Man_t *)calloc(1,0x120);
  (pTVar2->Pars).nBTLimit = 0;
  (pTVar2->Pars).nJustLimit = 0;
  (pTVar2->Pars).nBTThis = 0;
  (pTVar2->Pars).nBTThisNc = 0;
  (pTVar2->Pars).nJustThis = 0;
  (pTVar2->Pars).nBTTotal = 0;
  (pTVar2->Pars).nJustTotal = 0;
  (pTVar2->Pars).VarDecay = 0.0;
  (pTVar2->Pars).nJustLimit = 2000;
  (pTVar2->Pars).fUseMaxFF = 0;
  (pTVar2->Pars).fVerbose = 1;
  (pTVar2->Pars).VarDecay = 0.95;
  (pTVar2->Pars).VarInc = 1;
  (pTVar2->Pars).fUseActive = 0;
  (pTVar2->Pars).fUseHighest = 1;
  (pTVar2->Pars).fUseLowest = 0;
  pTVar2->pAig = pAig;
  (pTVar2->Pars).nBTLimit = nBTLimit;
  (pTVar2->pClauses).nSize = 10000;
  (pTVar2->pJust).nSize = 10000;
  (pTVar2->pProp).nSize = 10000;
  ppGVar3 = (Gia_Obj_t **)malloc(80000);
  (pTVar2->pProp).pData = ppGVar3;
  ppGVar3 = (Gia_Obj_t **)malloc(80000);
  (pTVar2->pJust).pData = ppGVar3;
  ppGVar3 = (Gia_Obj_t **)malloc(80000);
  (pTVar2->pClauses).pData = ppGVar3;
  (pTVar2->pClauses).iHead = 1;
  (pTVar2->pClauses).iTail = 1;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  pTVar2->vModel = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  pTVar2->vLevReas = pVVar4;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(8000);
  pVVar6->pArray = ppvVar7;
  pTVar2->vTemp = pVVar6;
  (pTVar2->pStore).iCur = 0x10;
  (pTVar2->pStore).nSize = 10000;
  piVar5 = (int *)malloc(40000);
  (pTVar2->pStore).pData = piVar5;
  iVar1 = pAig->nObjs;
  piVar5 = (int *)calloc((long)iVar1 * 2,4);
  pTVar2->pWatches = piVar5;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  pTVar2->vWatchLits = pVVar4;
  pfVar8 = (float *)calloc((long)iVar1,4);
  pTVar2->pActivity = pfVar8;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar4->pArray = piVar5;
  pTVar2->vActiveVars = pVVar4;
  return pTVar2;
}

Assistant:

Tas_Man_t * Tas_ManAlloc( Gia_Man_t * pAig, int nBTLimit )
{
    Tas_Man_t * p;
    p = ABC_CALLOC( Tas_Man_t, 1 );
    Tas_SetDefaultParams( &p->Pars );
    p->pAig           = pAig;
    p->Pars.nBTLimit  = nBTLimit;
    p->pProp.nSize    = p->pJust.nSize = p->pClauses.nSize = 10000;
    p->pProp.pData    = ABC_ALLOC( Gia_Obj_t *, p->pProp.nSize );
    p->pJust.pData    = ABC_ALLOC( Gia_Obj_t *, p->pJust.nSize );
    p->pClauses.pData = ABC_ALLOC( Gia_Obj_t *, p->pClauses.nSize );
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->vModel         = Vec_IntAlloc( 1000 );
    p->vLevReas       = Vec_IntAlloc( 1000 );
    p->vTemp          = Vec_PtrAlloc( 1000 );
    p->pStore.iCur    = 16;
    p->pStore.nSize   = 10000;
    p->pStore.pData   = ABC_ALLOC( int, p->pStore.nSize );
    p->pWatches       = ABC_CALLOC( int, 2 * Gia_ManObjNum(pAig) );
    p->vWatchLits     = Vec_IntAlloc( 100 );
    p->pActivity      = ABC_CALLOC( float, Gia_ManObjNum(pAig) );
    p->vActiveVars    = Vec_IntAlloc( 100 );
    return p;
}